

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dwarf_debugnames.c
# Opt level: O1

int dwarf_dnames_bucket(Dwarf_Dnames_Head dn,Dwarf_Unsigned bucket_number,Dwarf_Unsigned *name_index
                       ,Dwarf_Unsigned *collision_count,Dwarf_Error *error)

{
  Dwarf_Small *pDVar1;
  bool bVar2;
  int iVar3;
  Dwarf_DN_Bucket_s *pDVar4;
  ulong uVar5;
  char *msg;
  Dwarf_Signed errval;
  Dwarf_Debug dbg;
  ulong uVar6;
  ulong uVar7;
  Dwarf_Unsigned DVar8;
  Dwarf_DN_Bucket_s *pDVar9;
  ulong __nmemb;
  ulong uVar10;
  long lVar11;
  undefined8 local_50;
  Dwarf_Unsigned *local_48;
  Dwarf_Unsigned local_40;
  Dwarf_Unsigned *local_38;
  
  if ((dn == (Dwarf_Dnames_Head)0x0) || (dn->dn_magic != 0xabcd)) {
    msg = "DW_DLE_DBG_NULL: bad Head argument to dwarf_dnames_bucket";
    errval = 0x51;
    dbg = (Dwarf_Debug)0x0;
LAB_0019bdf3:
    _dwarf_error_string(dbg,error,errval,msg);
LAB_0019bdfb:
    iVar3 = 1;
  }
  else {
    __nmemb = dn->dn_bucket_count;
    if (__nmemb <= bucket_number) {
      return -1;
    }
    if (dn->dn_bucket_array == (Dwarf_DN_Bucket_s *)0x0) {
      dbg = dn->dn_dbg;
      pDVar4 = (Dwarf_DN_Bucket_s *)calloc(__nmemb,0x10);
      dn->dn_bucket_array = pDVar4;
      if (pDVar4 == (Dwarf_DN_Bucket_s *)0x0) {
        msg = "DW_DLE_ALLOC_FAIL: .debug_names bucket array could not be allocated";
        errval = 0x3e;
        goto LAB_0019bdf3;
      }
      lVar11 = 0;
      uVar10 = 0;
      local_48 = name_index;
      local_40 = bucket_number;
      local_38 = collision_count;
      do {
        pDVar1 = dn->dn_buckets;
        local_50 = 0;
        if (pDVar1 + __nmemb * 4 < pDVar1 + lVar11 + 4) {
          _dwarf_error_string(dbg,error,0x14b,
                              "DW_DLE_READ_LITTLEENDIAN_ERROR Read would end past the end of section"
                             );
          goto LAB_0019bdfb;
        }
        (*dbg->de_copy_word)(&local_50,pDVar1 + lVar11,4);
        *(undefined8 *)((long)&dn->dn_bucket_array->db_nameindex + lVar11 * 4) = local_50;
        uVar10 = uVar10 + 1;
        __nmemb = dn->dn_bucket_count;
        lVar11 = lVar11 + 4;
      } while (uVar10 < __nmemb);
      uVar10 = 0;
      do {
        name_index = local_48;
        collision_count = local_38;
        bucket_number = local_40;
        if (__nmemb <= uVar10) break;
        pDVar4 = dn->dn_bucket_array;
        DVar8 = pDVar4[uVar10].db_nameindex;
        if (DVar8 == 0) {
          uVar5 = uVar10 + 1;
LAB_0019bf43:
          bVar2 = false;
        }
        else {
          pDVar9 = pDVar4 + uVar10;
          uVar6 = uVar10;
          do {
            uVar6 = uVar6 + 1;
            pDVar9 = pDVar9 + 1;
            uVar5 = uVar10;
            uVar7 = __nmemb;
            if (__nmemb == uVar6) goto LAB_0019bf3e;
          } while (pDVar9->db_nameindex == 0);
          pDVar4[uVar10].db_collisioncount = pDVar9->db_nameindex - DVar8;
          uVar5 = uVar6;
          uVar7 = uVar6;
LAB_0019bf3e:
          if (uVar7 < __nmemb) goto LAB_0019bf43;
          DVar8 = dn->dn_name_count - DVar8;
          if (DVar8 == 0) {
            DVar8 = 1;
          }
          pDVar4[uVar10].db_collisioncount = DVar8;
          bVar2 = true;
        }
        uVar10 = uVar5;
      } while (!bVar2);
    }
    pDVar4 = dn->dn_bucket_array;
    iVar3 = -1;
    if (pDVar4 != (Dwarf_DN_Bucket_s *)0x0) {
      *name_index = pDVar4[bucket_number].db_nameindex;
      *collision_count = pDVar4[bucket_number].db_collisioncount;
      iVar3 = 0;
    }
  }
  return iVar3;
}

Assistant:

int
dwarf_dnames_bucket(Dwarf_Dnames_Head dn,
    Dwarf_Unsigned      bucket_number,
    Dwarf_Unsigned    * name_index,
    Dwarf_Unsigned    * collision_count,
    Dwarf_Error *       error)
{
    struct Dwarf_DN_Bucket_s *cur = 0;
    int res = 0;

    if (!dn || dn->dn_magic != DWARF_DNAMES_MAGIC) {
        _dwarf_error_string(NULL, error,DW_DLE_DBG_NULL,
            "DW_DLE_DBG_NULL: bad Head argument to "
            "dwarf_dnames_bucket");
        return DW_DLV_ERROR;
    }
    if (bucket_number >= dn->dn_bucket_count) {
        return DW_DLV_NO_ENTRY;
    }
    res  = _dwarf_initialize_bucket_details(dn,error);
    if (res == DW_DLV_ERROR) {
        return res;
    }
    if (!dn->dn_bucket_array) {
        return DW_DLV_NO_ENTRY;
    }
    cur = dn->dn_bucket_array + bucket_number;
    *name_index = cur->db_nameindex;
    *collision_count = cur->db_collisioncount;
    return DW_DLV_OK;
}